

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  int line_00;
  bool bVar1;
  BinOpr BVar2;
  int line_1;
  BinOpr nextop;
  expdesc v2;
  int line;
  UnOpr uop;
  BinOpr op;
  int limit_local;
  expdesc *v_local;
  LexState *ls_local;
  
  enterlevel(ls);
  v2.f = getunopr((ls->t).token);
  if (v2.f == OPR_NOUNOPR) {
    simpleexp(ls,v);
  }
  else {
    v2.t = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,v2.f,v,v2.t);
  }
  line = getbinopr((ls->t).token);
  while( true ) {
    bVar1 = false;
    if (line != 0x15) {
      bVar1 = limit < (int)(uint)priority[(uint)line].left;
    }
    if (!bVar1) break;
    line_00 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,line,v);
    BVar2 = subexpr(ls,(expdesc *)&line_1,(uint)priority[(uint)line].right);
    luaK_posfix(ls->fs,line,v,(expdesc *)&line_1,line_00);
    line = BVar2;
  }
  ls->L->nCcalls = ls->L->nCcalls - 1;
  return line;
}

Assistant:

static BinOpr subexpr(LexState *ls, expdesc *v, int limit) {
    BinOpr op;
    UnOpr uop;
    enterlevel(ls);
    uop = getunopr(ls->t.token);
    if (uop != OPR_NOUNOPR) {
        int line = ls->linenumber;
        luaX_next(ls);
        subexpr(ls, v, UNARY_PRIORITY);
        luaK_prefix(ls->fs, uop, v, line);
    } else simpleexp(ls, v);
    /* expand while operators have priorities higher than 'limit' */
    op = getbinopr(ls->t.token);
    while (op != OPR_NOBINOPR && priority[op].left > limit) {
        expdesc v2;
        BinOpr nextop;
        int line = ls->linenumber;
        luaX_next(ls);
        luaK_infix(ls->fs, op, v);
        /* read sub-expression with higher priority */
        nextop = subexpr(ls, &v2, priority[op].right);
        luaK_posfix(ls->fs, op, v, &v2, line);
        op = nextop;
    }
    leavelevel(ls);
    return op;  /* return first untreated operator */
}